

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::test(ShaderSourceReplaceCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  char *pcVar4;
  char *__s;
  char *secondSource;
  char *firstSource;
  string secondSourceStr;
  string firstSourceStr;
  Shader shader;
  char *local_258;
  pointer local_250;
  string local_248;
  string local_228;
  Shader local_208;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  glu::Shader::Shader(&local_208,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,
                      this->m_shaderType);
  pcVar4 = (char *)0x0;
  if (this->m_shaderType == SHADERTYPE_FRAGMENT) {
    pcVar4 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 o_fragColor;\nvoid main (void)\n{\n\to_fragColor = vec4(0.0);\n}\n"
    ;
  }
  __s = "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n";
  if (this->m_shaderType != SHADERTYPE_VERTEX) {
    __s = pcVar4;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,__s,(allocator<char> *)local_1a0);
  generateSecondSource_abi_cxx11_(&local_248,this);
  local_250 = local_228._M_dataplus._M_p;
  local_258 = local_248._M_dataplus._M_p;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Setting shader source.",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  glu::Shader::setSources(&local_208,1,&local_250,(int *)0x0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x29c);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Replacing shader source.",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  glu::Shader::setSources(&local_208,1,&local_258,(int *)0x0);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x2a1);
  verifyShaderSourceReplaced(this,&local_208,&local_228,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  glu::Shader::~Shader(&local_208);
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log				= m_testCtx.getLog();

		glu::Shader			shader			(m_context.getRenderContext(), m_shaderType);

		const std::string	firstSourceStr	= generateFirstSource();
		const std::string	secondSourceStr	= generateSecondSource();

		const char*			firstSource		= firstSourceStr.c_str();
		const char*			secondSource	= secondSourceStr.c_str();

		log << TestLog::Message << "Setting shader source." << TestLog::EndMessage;

		shader.setSources(1, &firstSource, 0);
		GLU_CHECK();

		log << TestLog::Message << "Replacing shader source." << TestLog::EndMessage;

		shader.setSources(1, &secondSource, 0);
		GLU_CHECK();

		verifyShaderSourceReplaced(shader, firstSourceStr, secondSourceStr);
	}